

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

void GEO::CmdLine::declare_arg(string *name,int default_value,string *description,ArgFlags flags)

{
  String local_48 [36];
  ArgFlags local_24;
  string *psStack_20;
  ArgFlags flags_local;
  string *description_local;
  string *psStack_10;
  int default_value_local;
  string *name_local;
  
  local_24 = flags;
  psStack_20 = description;
  description_local._4_4_ = default_value;
  psStack_10 = name;
  String::to_string<int>(local_48,(int *)((long)&description_local + 4));
  declare_arg(name,ARG_INT,(string *)local_48,psStack_20,local_24);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

inline void declare_arg(
            const std::string& name,
            int default_value,
            const std::string& description,
            ArgFlags flags = ARG_FLAGS_DEFAULT
        ) {
            declare_arg(
                name, ARG_INT, String::to_string(default_value),
                description, flags
            );
        }